

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::label(Simulator *this,PCode *code)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  scope_not_found *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_119;
  undefined1 local_118 [7];
  bool is_found;
  bool local_f5;
  int local_f4;
  Symbol local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string name;
  PCode *code_local;
  Simulator *this_local;
  
  name.field_2._8_8_ = code;
  psVar2 = PCode::first_abi_cxx11_(code);
  std::__cxx11::string::string((string *)local_38,(string *)psVar2);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)local_38);
  bVar1 = std::operator==(&local_58,"_begin_while_");
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    ScopeTree::push(&this->tree_);
    local_f4 = 1;
    local_f5 = true;
    Symbol::Symbol(&local_f0,(string *)local_38,&local_f4,&local_f5);
    ScopeTree::define(&this->tree_,&local_f0);
    Symbol::~Symbol(&local_f0);
  }
  else {
    std::__cxx11::string::substr((ulong)local_118,(ulong)local_38);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_118,"_end_while_");
    std::__cxx11::string::~string((string *)local_118);
    if (bVar1) {
      do {
        local_119 = 0;
        std::__cxx11::string::substr((ulong)&e,(ulong)local_38);
        std::operator+(&local_140,"_begin_while_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
        ScopeTree::resolve(&this->tree_,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&e);
        ScopeTree::pop(&this->tree_);
      } while( true );
    }
    std::__cxx11::string::substr((ulong)&local_188,(ulong)local_38);
    bVar1 = std::operator==(&local_188,"_begin_if_");
    std::__cxx11::string::~string((string *)&local_188);
    if (bVar1) {
      ScopeTree::push(&this->tree_);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_1a8,(ulong)local_38);
      bVar1 = std::operator==(&local_1a8,"_else_");
      std::__cxx11::string::~string((string *)&local_1a8);
      if (bVar1) {
        ScopeTree::pop(&this->tree_);
        ScopeTree::push(&this->tree_);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_1c8,(ulong)local_38);
        bVar1 = std::operator==(&local_1c8,"_end_if_");
        std::__cxx11::string::~string((string *)&local_1c8);
        if (bVar1) {
          ScopeTree::pop(&this->tree_);
        }
      }
    }
  }
  inc_eip(this);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Simulator::label(const PCode &code) {
    std::string name = code.first();

    if (name.substr(0, 13) == "_begin_while_") {
        tree_.push();
        tree_.define(Symbol(name, 1, true));
    } else if (name.substr(0, 11) == "_end_while_") {
        while (true) {
            bool is_found = false;
            try {
                tree_.resolve("_begin_while_" + name.substr(11));
                tree_.pop();
                is_found = true;
            } catch (const scope_not_found &e) {
                is_found = false;
            }
            if (!is_found) {
                break;
            }
        }
    } else if (name.substr(0, 10) == "_begin_if_") {
        tree_.push();
    } else if (name.substr(0, 6) == "_else_") {
        tree_.pop();
        tree_.push();
    } else if (name.substr(0, 8) == "_end_if_") {
        tree_.pop();
    }

    inc_eip();
}